

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

SourceCodeInfo * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::SourceCodeInfo>
          (Tables *this,SourceCodeInfo *dummy)

{
  SourceCodeInfo *this_00;
  SourceCodeInfo *local_38 [3];
  SourceCodeInfo *local_20;
  SourceCodeInfo *result;
  SourceCodeInfo *dummy_local;
  Tables *this_local;
  
  result = dummy;
  dummy_local = (SourceCodeInfo *)this;
  this_00 = (SourceCodeInfo *)operator_new(0x30);
  SourceCodeInfo::SourceCodeInfo(this_00);
  local_38[0] = this_00;
  local_20 = this_00;
  std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::push_back
            (&this->messages_,(value_type *)local_38);
  return local_20;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* dummy) {
  Type* result = new Type;
  messages_.push_back(result);
  return result;
}